

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall TPZMatrix<float>::Subst_Forward(TPZMatrix<float> *this,TPZFMatrix<float> *B)

{
  int iVar1;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float local_40;
  float local_34;
  
  lVar5 = (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar2 = 0;
  if ((lVar5 == CONCAT44(extraout_var,iVar1)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    iVar2 = 1;
    if (CONCAT44(extraout_var_00,iVar1) != 0 && -1 < extraout_var_00) {
      lVar5 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar5);
        if (0 < (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol) {
          lVar4 = 0;
          do {
            if (lVar5 == 0) {
              local_40 = 0.0;
            }
            else {
              local_40 = 0.0;
              lVar3 = 0;
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar5,lVar3);
                (*(B->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                  [0x24])(B,lVar3,lVar4);
                local_40 = local_40 + extraout_XMM0_Da_01 * extraout_XMM0_Da_00;
                lVar3 = lVar3 + 1;
              } while (lVar5 != lVar3);
            }
            (*(B->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0x24])(B,lVar5,lVar4);
            local_34 = (extraout_XMM0_Da_02 - local_40) / extraout_XMM0_Da;
            (*(B->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0x23])(B,lVar5,lVar4,&local_34);
            lVar4 = lVar4 + 1;
          } while (lVar4 < (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol);
        }
        lVar5 = lVar5 + 1;
        iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
      } while (lVar5 < CONCAT44(extraout_var_01,iVar1));
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}